

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date_trunc.cpp
# Opt level: O1

date_t duckdb::DateTrunc::
       UnaryFunction<duckdb::date_t,duckdb::date_t,duckdb::DateTrunc::MonthOperator>(date_t input)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int32_t iVar4;
  undefined1 auVar5 [12];
  date_t result;
  date_t local_3c;
  string local_38;
  
  bVar1 = duckdb::Value::IsFinite<duckdb::date_t>(input);
  if (bVar1) {
    iVar2 = duckdb::Date::ExtractYear(input);
    iVar3 = duckdb::Date::ExtractMonth(input);
    iVar4 = duckdb::Date::FromDate(iVar2,iVar3,1);
    return (date_t)iVar4;
  }
  bVar1 = duckdb::TryCast::Operation<duckdb::date_t,duckdb::date_t>(input,&local_3c,false);
  if (bVar1) {
    return (date_t)local_3c.days;
  }
  auVar5 = __cxa_allocate_exception(0x10);
  CastExceptionText<duckdb::date_t,duckdb::date_t>
            (&local_38,(duckdb *)(ulong)(uint)input.days,(date_t)auVar5._8_4_);
  duckdb::InvalidInputException::InvalidInputException(auVar5._0_8_,(string *)&local_38);
  __cxa_throw(auVar5._0_8_,&InvalidInputException::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

static inline TR UnaryFunction(TA input) {
		if (Value::IsFinite(input)) {
			return OP::template Operation<TA, TR>(input);
		} else {
			return Cast::template Operation<TA, TR>(input);
		}
	}